

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
          (buffer_appender<char> out,unsigned_long value,basic_format_specs<char> *specs)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  long lVar2;
  char *pcVar3;
  unsigned_long uVar4;
  ulong uVar5;
  buffer<char> *buf;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  anon_class_16_2_92d121e5 write;
  char buffer [17];
  anon_class_16_2_92d121e5 local_48;
  char local_38 [32];
  
  uVar4 = value;
  lVar8 = 0;
  do {
    lVar7 = lVar8;
    lVar8 = lVar7 + 1;
    bVar9 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar9);
  local_48.num_digits = (int)lVar8;
  local_48.value = value;
  if (specs == (basic_format_specs<char> *)0x0) {
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18);
    if (uVar5 < lVar2 + lVar8 + 2U) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18);
    }
    uVar6 = lVar2 + 1;
    if (uVar5 < uVar6) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar6 = lVar2 + 1;
    }
    *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
              ) = uVar6;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
     + lVar2) = 0x30;
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar2 + 1;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
    }
    *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
              ) = uVar5;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
     + lVar2) = 0x78;
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar2 + lVar8;
    if (uVar5 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x18)) {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x10) = uVar5;
      if (*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   8) != 0) {
        pcVar3 = (char *)(lVar8 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                                  .container + 8) + lVar2);
        do {
          pcVar3 = pcVar3 + -1;
          *pcVar3 = "0123456789abcdef"[(uint)value & 0xf];
          bVar9 = 0xf < value;
          value = value >> 4;
        } while (bVar9);
        return (buffer_appender<char>)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
      }
    }
    pcVar3 = local_38 + lVar7;
    do {
      *pcVar3 = "0123456789abcdef"[(uint)value & 0xf];
      pcVar3 = pcVar3 + -1;
      bVar9 = 0xf < value;
      value = value >> 4;
    } while (bVar9);
    bVar1.container =
         (buffer<char> *)
         std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char*,fmt::v7::detail::buffer_appender<char>>(local_38,local_38 + lVar7 + 1,out);
  }
  else {
    bVar1.container =
         (buffer<char> *)
         write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>(fmt::v7::detail::buffer_appender<char>,unsigned_long,fmt::v7::basic_format_specs<char>const*)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_&>
                   (out,specs,lVar7 + 3U,lVar7 + 3U,&local_48);
  }
  return (buffer_appender<char>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar1.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}